

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerApp::OnDiagGetAnswerMessage
          (CommissionerApp *this,string *aPeerAddr,NetDiagData *aDiagAnsMsg)

{
  pointer puVar1;
  bool bVar2;
  mapped_type *this_00;
  ErrorCode local_70 [4];
  Error local_60;
  undefined1 local_38 [8];
  Address addr;
  NetDiagData *aDiagAnsMsg_local;
  string *aPeerAddr_local;
  CommissionerApp *this_local;
  
  addr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)aDiagAnsMsg;
  Address::Address((Address *)local_38);
  Address::Set(&local_60,(Address *)local_38,aPeerAddr);
  local_70[0] = kNone;
  bVar2 = commissioner::operator==(&local_60,local_70);
  Error::~Error(&local_60);
  puVar1 = addr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    this_00 = std::
              map<ot::commissioner::Address,_ot::commissioner::NetDiagData,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
              ::operator[](&this->mDiagAnsDataMap,(key_type *)local_38);
    NetDiagData::operator=(this_00,(NetDiagData *)puVar1);
    Address::~Address((Address *)local_38);
    return;
  }
  abort();
}

Assistant:

void CommissionerApp::OnDiagGetAnswerMessage(const std::string &aPeerAddr, const NetDiagData &aDiagAnsMsg)
{
    Address addr;

    SuccessOrDie(addr.Set(aPeerAddr));

    mDiagAnsDataMap[addr] = aDiagAnsMsg;
}